

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_php_struct(t_php_generator *this,t_struct *tstruct,bool is_exception)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  int __oflag;
  undefined8 uVar3;
  allocator local_99;
  string local_98 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string f_struct_name;
  ofstream_with_content_based_conditional_update *f_struct;
  bool is_exception_local;
  t_struct *tstruct_local;
  t_php_generator *this_local;
  
  f_struct_name.field_2._8_8_ = &this->f_types_;
  if ((this->classmap_ & 1U) == 0) {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_68,&this->package_dir_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar1));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,".php");
    std::__cxx11::string::~string((string *)&local_68);
    uVar3 = f_struct_name.field_2._8_8_;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar2,&local_99);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)uVar3,(char *)local_98,__oflag);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    generate_program_header(this,(ostream *)f_struct_name.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_48);
  }
  uVar3 = f_struct_name.field_2._8_8_;
  generate_php_struct_definition
            (this,(ostream *)f_struct_name.field_2._8_8_,tstruct,is_exception,false);
  if ((this->classmap_ & 1U) == 0) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)f_struct_name.field_2._8_8_,(int)uVar3);
  }
  return;
}

Assistant:

void t_php_generator::generate_php_struct(t_struct* tstruct, bool is_exception) {
  ofstream_with_content_based_conditional_update& f_struct = f_types_;
  if (!classmap_) {
    string f_struct_name = package_dir_ + tstruct->get_name() + ".php";
    f_struct.open(f_struct_name.c_str());
    generate_program_header(f_struct);
  }
  generate_php_struct_definition(f_struct, tstruct, is_exception);
  if (!classmap_) {
    f_struct.close();
  }
}